

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O0

void __thiscall UnitTests::Assert::NotEquals<int,int>(Assert *this,int *expected,int *actual)

{
  string local_40 [32];
  int *local_20;
  int *actual_local;
  int *expected_local;
  Assert *this_local;
  
  local_20 = actual;
  actual_local = expected;
  expected_local = (int *)this;
  std::__cxx11::string::string(local_40);
  NotEquals<int,int>(this,(string *)local_40,actual_local,local_20);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void NotEquals(const T& expected, const U& actual) const
        {
            NotEquals(std::string(), expected, actual);
        }